

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O3

void __thiscall QScrollAreaPrivate::updateScrollBars(QScrollAreaPrivate *this)

{
  Data *pDVar1;
  QWidgetData *pQVar2;
  QObject *pQVar3;
  long lVar4;
  Representation RVar5;
  int iVar6;
  Representation RVar7;
  uint uVar8;
  QSizePolicy QVar9;
  int iVar10;
  QSize QVar11;
  QSize QVar12;
  QSize QVar13;
  QLayout *pQVar14;
  Representation RVar15;
  Representation RVar16;
  int iVar17;
  Representation step;
  Representation RVar18;
  ulong uVar19;
  QWidget *pQVar20;
  Representation RVar21;
  Representation RVar22;
  ulong uVar23;
  Representation RVar24;
  ulong uVar25;
  Representation step_00;
  int iVar26;
  long in_FS_OFFSET;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->widget).wp.d;
  if (((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
     ((this->widget).wp.value == (QObject *)0x0)) goto LAB_00471d62;
  pQVar2 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  iVar6 = (pQVar2->crect).x2.m_i;
  iVar10 = (pQVar2->crect).y2.m_i;
  iVar17 = (pQVar2->crect).x1.m_i;
  iVar26 = (pQVar2->crect).y1.m_i;
  QVar11 = QAbstractScrollArea::maximumViewportSize
                     (*(QAbstractScrollArea **)
                       &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                        super_QWidgetPrivate.field_0x8);
  pDVar1 = (this->widget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar20 = (QWidget *)0x0;
  }
  else {
    pQVar20 = (QWidget *)(this->widget).wp.value;
  }
  QVar12 = qSmartMinSize(pQVar20);
  RVar24 = QVar12.ht.m_i;
  pDVar1 = (this->widget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar20 = (QWidget *)0x0;
  }
  else {
    pQVar20 = (QWidget *)(this->widget).wp.value;
  }
  step_00.m_i = (iVar6 - iVar17) + 1;
  step.m_i = (iVar10 - iVar26) + 1;
  QVar13 = qSmartMaxSize(pQVar20,(Alignment)0x0);
  uVar19 = (ulong)QVar13 >> 0x20;
  RVar21 = QVar12.wd.m_i;
  RVar15 = QVar11.wd.m_i;
  RVar5 = QVar11.ht.m_i;
  RVar22.m_i = RVar21.m_i;
  if (this->resizable == true) {
    pQVar14 = QWidget::layout((QWidget *)(this->widget).wp.value);
    pQVar20 = (QWidget *)(this->widget).wp.value;
    if (pQVar14 == (QLayout *)0x0) {
      QVar9 = QWidget::sizePolicy(pQVar20);
      if (((uint)QVar9.field_0 >> 0x1d & 1) != 0) goto LAB_00471afa;
    }
    else {
      pQVar14 = QWidget::layout(pQVar20);
      iVar6 = (*(pQVar14->super_QLayoutItem)._vptr_QLayoutItem[9])(&pQVar14->super_QLayoutItem);
      if ((char)iVar6 != '\0') {
LAB_00471afa:
        if (RVar21.m_i < step_00.m_i) {
          RVar22.m_i = step_00.m_i;
        }
        RVar16.m_i = RVar24.m_i;
        if (RVar24.m_i < step.m_i) {
          RVar16.m_i = step.m_i;
        }
        RVar7 = QVar13.wd.m_i;
        uVar23 = (ulong)(uint)RVar22.m_i;
        if (RVar7.m_i <= RVar22.m_i) {
          uVar23 = (ulong)QVar13 & 0xffffffff;
        }
        RVar22.m_i = (int)uVar23;
        RVar18 = QVar13.ht.m_i;
        if (RVar18.m_i <= RVar16.m_i) {
          RVar16.m_i = RVar18.m_i;
        }
        pQVar3 = (this->widget).wp.value;
        uVar8 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,uVar23);
        uVar23 = (ulong)uVar8;
        if ((this->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAsNeeded) {
          iVar6 = (**(code **)(*(long *)&(((this->super_QAbstractScrollAreaPrivate).vbar)->
                                         super_QAbstractSlider).super_QWidget + 0x70))();
          if (RVar21.m_i < RVar15.m_i) {
            QVar12 = QVar11;
          }
          if (RVar24.m_i < RVar5.m_i) {
            RVar24.m_i = RVar5.m_i;
          }
          RVar21.m_i = QVar12.wd.m_i.m_i;
          if (RVar7.m_i <= QVar12.wd.m_i.m_i) {
            RVar21.m_i = RVar7.m_i;
          }
          if (RVar18.m_i <= RVar24.m_i) {
            RVar24.m_i = RVar18.m_i;
          }
          pQVar3 = (this->widget).wp.value;
          iVar10 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,RVar21.m_i - iVar6);
          if (iVar10 <= RVar5.m_i) {
            for (; (RVar5.m_i < (int)uVar8 && (iVar6 != 0)); iVar6 = iVar6 + -1) {
              RVar21.m_i = RVar21.m_i - 1;
              pQVar3 = (this->widget).wp.value;
              uVar8 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,RVar21.m_i);
              uVar23 = (ulong)uVar8;
            }
          }
          uVar8 = (uint)uVar23;
          uVar19 = (ulong)(uint)RVar24.m_i;
          if (RVar24.m_i <= (int)uVar8) {
            uVar19 = uVar23;
          }
          QVar13.ht.m_i = 0;
          QVar13.wd.m_i = RVar21.m_i;
        }
        RVar24.m_i = uVar8;
        if ((int)uVar8 < RVar16.m_i) {
          RVar24.m_i = RVar16.m_i;
        }
      }
    }
  }
  if (this->resizable == true) {
    if (((RVar22.m_i <= RVar15.m_i) && (RVar24.m_i <= RVar5.m_i)) &&
       (RVar15.m_i <= QVar13.wd.m_i.m_i && RVar5.m_i <= (int)uVar19)) {
      step.m_i = RVar5.m_i;
      step_00.m_i = RVar15.m_i;
    }
    if (RVar22.m_i < step_00.m_i) {
      RVar22.m_i = step_00.m_i;
    }
    if (RVar24.m_i < step.m_i) {
      RVar24.m_i = step.m_i;
    }
    uVar23 = (ulong)(uint)RVar22.m_i;
    if (QVar13.wd.m_i.m_i <= RVar22.m_i) {
      uVar23 = (ulong)QVar13 & 0xffffffff;
    }
    uVar25 = (ulong)(uint)RVar24.m_i;
    if ((int)uVar19 <= RVar24.m_i) {
      uVar25 = uVar19;
    }
    local_40 = (QSize)(uVar23 | uVar25 << 0x20);
    QWidget::resize((QWidget *)(this->widget).wp.value,&local_40);
    lVar4 = *(long *)((this->widget).wp.value + 0x20);
    iVar6 = *(int *)(lVar4 + 0x14);
    iVar10 = *(int *)(lVar4 + 0x18);
    iVar17 = *(int *)(lVar4 + 0x1c) + 1;
    iVar26 = *(int *)(lVar4 + 0x20) + 1;
  }
  else {
    lVar4 = *(long *)((this->widget).wp.value + 0x20);
    iVar6 = *(int *)(lVar4 + 0x14);
    iVar10 = *(int *)(lVar4 + 0x18);
    iVar17 = *(int *)(lVar4 + 0x1c) + 1;
    iVar26 = *(int *)(lVar4 + 0x20) + 1;
    if (iVar17 - iVar6 <= RVar15.m_i && iVar26 - iVar10 <= RVar5.m_i) {
      step_00.m_i = RVar15.m_i;
      step.m_i = RVar5.m_i;
    }
  }
  QAbstractSlider::setRange
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0,
             iVar17 - (iVar6 + step_00.m_i));
  QAbstractSlider::setPageStep
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,step_00.m_i);
  QAbstractSlider::setRange
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0,
             iVar26 - (iVar10 + step.m_i));
  QAbstractSlider::setPageStep
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,step.m_i);
  updateWidgetPosition(this);
LAB_00471d62:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollAreaPrivate::updateScrollBars()
{
    Q_Q(QScrollArea);
    if (!widget)
        return;
    QSize p = viewport->size();
    QSize m = q->maximumViewportSize();

    QSize min = qSmartMinSize(widget);
    QSize max = qSmartMaxSize(widget);

    if (resizable) {
        if ((widget->layout() ? widget->layout()->hasHeightForWidth() : widget->sizePolicy().hasHeightForWidth())) {
            QSize p_hfw = p.expandedTo(min).boundedTo(max);
            int h = widget->heightForWidth(p_hfw.width());
            // If the height we calculated requires a vertical scrollbar,
            // then we need to constrain the width and calculate the height again,
            // otherwise we end up flipping the scrollbar on and off all the time.
            if (vbarpolicy == Qt::ScrollBarAsNeeded) {
                int vbarWidth = vbar->sizeHint().width();
                QSize m_hfw = m.expandedTo(min).boundedTo(max);
                // is there any point in searching?
                if (widget->heightForWidth(m_hfw.width() - vbarWidth) <= m.height()) {
                    while (h > m.height() && vbarWidth) {
                        --vbarWidth;
                        --m_hfw.rwidth();
                        h = widget->heightForWidth(m_hfw.width());
                    }
                }
                max = QSize(m_hfw.width(), qMax(m_hfw.height(), h));
            }
            min = QSize(p_hfw.width(), qMax(p_hfw.height(), h));
        }
    }

    if ((resizable && m.expandedTo(min) == m && m.boundedTo(max) == m)
        || (!resizable && m.expandedTo(widget->size()) == m))
        p = m; // no scroll bars needed

    if (resizable)
        widget->resize(p.expandedTo(min).boundedTo(max));
    QSize v = widget->size();

    hbar->setRange(0, v.width() - p.width());
    hbar->setPageStep(p.width());
    vbar->setRange(0, v.height() - p.height());
    vbar->setPageStep(p.height());
    updateWidgetPosition();

}